

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

int GetIArg(size_t *i,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *opt)

{
  int iVar1;
  string errstr;
  string str;
  size_t *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  size_t *in_stack_ffffffffffffffa8;
  string local_30 [48];
  
  GetNextArg(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  iVar1 = std::__cxx11::stoi(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
  std::__cxx11::string::~string(local_30);
  return iVar1;
}

Assistant:

int GetIArg(size_t & i, const std::vector<std::string> & opt)
{
    std::string str = GetNextArg(i, opt);
    try {
        return stoi(str);
    }
    catch(...)
    {
        std::string errstr("Cannot convert to int: ");
        errstr += str;
        throw std::runtime_error(errstr);
    }
}